

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<short>::
Generators<Catch::Generators::GeneratorWrapper<short>,short,int>
          (Generators<short> *this,GeneratorWrapper<short> *moreGenerators,short *moreGenerators_1,
          int *moreGenerators_2)

{
  int *moreGenerators_local_2;
  short *moreGenerators_local_1;
  GeneratorWrapper<short> *moreGenerators_local;
  Generators<short> *this_local;
  
  IGenerator<short>::IGenerator(&this->super_IGenerator<short>);
  (this->super_IGenerator<short>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_007bdee8;
  std::
  vector<Catch::Generators::GeneratorWrapper<short>,_std::allocator<Catch::Generators::GeneratorWrapper<short>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<short>,_std::allocator<Catch::Generators::GeneratorWrapper<short>_>_>
  ::reserve(&this->m_generators,3);
  add_generators<Catch::Generators::GeneratorWrapper<short>,short,int>
            (this,moreGenerators,moreGenerators_1,moreGenerators_2);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }